

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O1

void __thiscall TestRestore::~TestRestore(TestRestore *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcAddImportPath(MODULE_PATH_C);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);

		nullcInitTypeinfoModule();
		nullcInitFileModule();
		nullcInitMathModule();
		nullcInitVectorModule();
		nullcInitRandomModule();
		nullcInitDynamicModule();
		nullcInitGCModule();
		nullcInitMemoryModule();
		nullcInitErrorModule();
		nullcInitStringModule();
		nullcInitIOModule();
		nullcInitCanvasModule();
#if defined(_MSC_VER)
		nullcInitWindowModule();
#endif
	}